

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::Hashing::hash_pnext_chain
               (StateRecorder *recorder,Hasher *h,void *pNext,DynamicStateInfo *dynamic_state_info,
               VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkStructureType VVar1;
  VkPipeline pNext_00;
  VkPipeline *ppVVar2;
  bool bVar3;
  VkBaseInStructure *pin;
  VkPipelineLibraryCreateInfoKHR *info;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  uint32_t uVar7;
  byte bVar8;
  char cVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  VkPipeline pNext_01;
  ulong uVar14;
  ulong uVar15;
  string local_50;
  
  info = (VkPipelineLibraryCreateInfoKHR *)pnext_chain_skip_ignored_entries(pNext);
  do {
    if (info == (VkPipelineLibraryCreateInfoKHR *)0x0) {
      return true;
    }
    VVar1 = info->sType;
    if (((ulong)VVar1 == 0x10) ||
       (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT))
    goto LAB_0015780a;
    uVar4 = h->h * 0x100000001b3 ^ (ulong)VVar1;
    h->h = uVar4;
    if ((int)VVar1 < 0x3b9e3cd1) {
      if (0x3b9cf897 < (int)VVar1) {
        if ((int)VVar1 < 0x3b9db031) {
          if ((int)VVar1 < 0x3b9d0c22) {
            if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
              uVar5 = (ulong)*(uint *)((long)&info->pLibraries + 4);
              uVar4 = (((uVar4 * 0x100000001b3 ^ uVar5) * 0x100000001b3 ^
                       (ulong)*(uint *)&info->field_0x14) * 0x100000001b3 ^
                      (ulong)*(uint *)&info->pLibraries) * 0x100000001b3 ^ (ulong)info->libraryCount
              ;
              h->h = uVar4;
              if (uVar5 == 0) goto LAB_0015780a;
              uVar12 = 0;
              do {
                uVar4 = (uVar4 * 0x100000001b3 ^ (ulong)*(uint *)(*(long *)(info + 1) + uVar12 * 8))
                        * 0x100000001b3 ^ (ulong)*(uint *)(*(long *)(info + 1) + 4 + uVar12 * 8);
                uVar12 = uVar12 + 1;
              } while (uVar5 != uVar12);
            }
            else {
              if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT)
              goto LAB_00157830;
              if (dynamic_state_info == (DynamicStateInfo *)0x0) {
                uVar7 = info->libraryCount;
                bVar8 = 1;
                cVar9 = '\0';
              }
              else {
                uVar7 = 0;
                if (dynamic_state_info->sample_locations_enable == false) {
                  uVar7 = info->libraryCount;
                }
                cVar9 = dynamic_state_info->sample_locations;
                bVar8 = dynamic_state_info->sample_locations_enable ^ 1;
              }
              uVar4 = (ulong)uVar7 ^ uVar4 * 0x100000001b3;
              h->h = uVar4;
              if (((bVar8 & info->libraryCount == 0) == 0) && (cVar9 == '\0')) {
                if (*(long *)(info + 1) != 0) {
                  return false;
                }
                uVar5 = (ulong)*(uint *)&info[1].field_0x14;
                uVar4 = (((uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info[1].pNext + 4)) *
                          0x100000001b3 ^ (ulong)info[1].libraryCount) * 0x100000001b3 ^
                        (ulong)*(uint *)&info[1].pNext) * 0x100000001b3 ^ uVar5;
                h->h = uVar4;
                if (uVar5 == 0) goto LAB_0015780a;
                uVar12 = 0;
                do {
                  uVar4 = (uVar4 * 0x100000001b3 ^ (ulong)*(uint *)(info[1].pLibraries + uVar12)) *
                          0x100000001b3 ^
                          (ulong)*(uint *)((long)info[1].pLibraries + uVar12 * 8 + 4);
                  uVar12 = uVar12 + 1;
                } while (uVar5 != uVar12);
              }
              else {
                uVar4 = uVar4 * 0x100000001b3;
              }
            }
            goto LAB_00157806;
          }
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
            if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
              uVar4 = (((((((((uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount) * 0x100000001b3 ^
                             (ulong)*(uint *)&info->field_0x14) * 0x100000001b3 ^
                            (ulong)*(uint *)&info->pLibraries) * 0x100000001b3 ^
                           (ulong)*(uint *)((long)&info->pLibraries + 4)) * 0x100000001b3 ^
                          (ulong)info[1].sType) * 0x100000001b3 ^ (ulong)*(uint *)&info[1].field_0x4
                         ) * 0x100000001b3 ^ (ulong)*(uint *)&info[1].pNext) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&info[1].pNext + 4)) * 0x100000001b3 ^
                      (ulong)info[1].libraryCount) * 0x100000001b3 ^
                      (ulong)*(uint *)&info[1].field_0x14;
              uVar5 = (ulong)*(uint *)&info[1].pLibraries;
              goto LAB_001577ff;
            }
            if (VVar1 != VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO)
            goto LAB_00157830;
            uVar5 = (ulong)info->libraryCount;
            uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
            ppVVar2 = info->pLibraries;
            h->h = uVar4;
            if (uVar5 != 0) {
              uVar12 = 0;
              do {
                uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar2 + uVar12 * 4);
                uVar12 = uVar12 + 1;
              } while (uVar5 != uVar12);
              goto LAB_00157806;
            }
            goto LAB_0015780a;
          }
          if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
             (dynamic_state_info->color_blend_advanced != true)) {
            uVar4 = (uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount) * 0x100000001b3 ^
                    (ulong)*(uint *)&info->field_0x14;
            goto LAB_001577a0;
          }
        }
        else if ((int)VVar1 < 0x3b9e1d92) {
          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
            uVar5 = (ulong)info->libraryCount;
            uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
            ppVVar2 = info->pLibraries;
            h->h = uVar4;
            if (uVar5 != 0) {
              uVar12 = 0;
              do {
                uVar4 = (uVar4 * 0x100000001b3 ^ (ulong)*(uint *)(ppVVar2 + uVar12)) * 0x100000001b3
                        ^ (ulong)*(uint *)((long)ppVVar2 + uVar12 * 8 + 4);
                uVar12 = uVar12 + 1;
              } while (uVar5 != uVar12);
              goto LAB_00157806;
            }
            goto LAB_0015780a;
          }
          if (VVar1 != VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
LAB_00157830:
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"Unsupported pNext found, cannot hash.","");
            log_error_pnext_chain(&local_50,info);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            return false;
          }
          ppVVar2 = info->pLibraries;
          if (ppVVar2 != (VkPipeline *)0x0) {
            h->h = ((((uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount) * 0x100000001b3 ^
                     (ulong)*(uint *)&info->field_0x14) * 0x100000001b3 ^
                    (ulong)*(uint *)(ppVVar2 + 2)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)ppVVar2 + 0x14)) * 0x100000001b3 ^
                   (ulong)*(uint *)(ppVVar2 + 3);
            pNext_00 = ppVVar2[1];
            pNext_01 = pNext_00;
            while (piVar6 = (int *)pnext_chain_skip_ignored_entries(pNext_01), piVar6 != (int *)0x0)
            {
              if (*piVar6 != 0x3b9e7769) {
                return false;
              }
              pNext_01 = *(VkPipeline *)(piVar6 + 2);
            }
            bVar3 = hash_pnext_chain(recorder,h,pNext_00,(DynamicStateInfo *)0x0,0);
            goto joined_r0x00156e03;
          }
        }
        else {
          if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT)
          goto LAB_00156f03;
          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO)
          goto LAB_00157037;
          if (VVar1 != VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR)
          goto LAB_00157830;
          lVar13 = *(long *)&info->libraryCount;
          if (lVar13 != 0) {
            h->h = ((((uVar4 * 0x100000001b3 ^ (ulong)*(uint *)(lVar13 + 0x10)) * 0x100000001b3 ^
                     (ulong)*(uint *)(lVar13 + 0x14)) * 0x100000001b3 ^
                    (ulong)*(uint *)(lVar13 + 0x18)) * 0x100000001b3 ^
                   (ulong)*(uint *)&info->pLibraries) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&info->pLibraries + 4);
            if (*(long *)(lVar13 + 8) != 0) {
              return false;
            }
            goto LAB_0015780a;
          }
        }
LAB_0015731d:
        uVar4 = uVar4 * 0x100000001b3;
        goto LAB_00157806;
      }
      if ((int)VVar1 < 0x3b9c5489) {
        if ((int)VVar1 < 0x3b9b9908) {
          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
            uVar5 = (ulong)*(uint *)&info->field_0x14;
            if (dynamic_state_info != (DynamicStateInfo *)0x0) {
              cVar9 = dynamic_state_info->rasterization_stream;
joined_r0x00157476:
              if (cVar9 != '\0') {
                uVar5 = 0;
              }
            }
            goto LAB_0015747a;
          }
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) goto LAB_00157830;
          if ((state_flags & 8) != 0) {
            uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
            h->h = uVar4;
          }
          if ((state_flags & 0xe) != 0) {
            uVar4 = uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount;
            h->h = uVar4;
          }
          if ((state_flags & 8) != 0) {
            if ((ulong)*(uint *)&info->field_0x14 != 0) {
              uVar5 = 0;
              do {
                uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)info->pLibraries + uVar5 * 4)
                ;
                uVar5 = uVar5 + 1;
              } while (*(uint *)&info->field_0x14 != uVar5);
            }
            uVar5 = (ulong)info[1].sType;
            uVar12 = (ulong)*(uint *)&info[1].field_0x4;
            goto LAB_0015742f;
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
          uVar5 = (ulong)info->libraryCount;
          uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
          if (uVar5 != 0) {
            uVar12 = 0;
            do {
              uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)info->pLibraries + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
          }
          uVar5 = (ulong)info[1].sType;
          uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
          if (uVar5 != 0) {
            uVar12 = 0;
            do {
              uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)info[1].pNext + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
          }
          uVar5 = (ulong)info[1].libraryCount;
          uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
          h->h = uVar4;
          if (uVar5 != 0) {
            uVar12 = 0;
            do {
              uVar4 = uVar4 * 0x100000001b3 ^
                      (ulong)*(uint *)((long)info[1].pLibraries + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
            goto LAB_00157806;
          }
        }
        else {
          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
            uVar4 = (uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info->pLibraries + 4)) *
                    0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
            uVar5 = (ulong)info->libraryCount;
            uVar12 = (ulong)*(uint *)&info->field_0x14;
            goto LAB_0015747e;
          }
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT)
          goto LAB_00157830;
          uVar5 = uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount;
          h->h = uVar5;
          uVar4 = 0;
          if (dynamic_state_info->discard_rectangle_mode == false) {
            uVar4 = (ulong)*(uint *)&info->field_0x14;
          }
          uVar10 = *(uint *)&info->pLibraries;
          uVar4 = (uVar4 ^ uVar5 * 0x100000001b3) * 0x100000001b3 ^ (ulong)uVar10;
          h->h = uVar4;
          if ((dynamic_state_info->discard_rectangle == false) && (uVar10 != 0)) {
            lVar13 = *(long *)(info + 1);
            lVar11 = 0;
            do {
              uVar4 = (((uVar4 * 0x100000001b3 ^ (ulong)*(uint *)(lVar13 + lVar11)) * 0x100000001b3
                       ^ (ulong)*(uint *)(lVar13 + 4 + lVar11)) * 0x100000001b3 ^
                      (ulong)*(uint *)(lVar13 + 8 + lVar11)) * 0x100000001b3 ^
                      (ulong)*(uint *)(lVar13 + 0xc + lVar11);
              lVar11 = lVar11 + 0x10;
            } while ((ulong)uVar10 << 4 != lVar11);
            goto LAB_00157806;
          }
        }
        goto LAB_0015780a;
      }
      if ((int)VVar1 < 0x3b9c9309) {
        if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
          uVar4 = uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount;
          if (dynamic_state_info == (DynamicStateInfo *)0x0) {
            uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
          }
          else {
            if (dynamic_state_info->conservative_rasterization_mode == true) {
              uVar4 = uVar4 * 0x100000001b3;
            }
            else {
              uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
            }
            if (dynamic_state_info->extra_primitive_overestimation_size != false) goto LAB_0015779c;
          }
LAB_001577a0:
          uVar5 = (ulong)*(uint *)&info->pLibraries;
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT)
          goto LAB_00157830;
          uVar5 = (ulong)*(uint *)&info->field_0x14;
          if (dynamic_state_info != (DynamicStateInfo *)0x0) {
            cVar9 = dynamic_state_info->depth_clip_enable;
            goto joined_r0x00157476;
          }
LAB_0015747a:
          uVar12 = (ulong)info->libraryCount;
LAB_0015747e:
          uVar4 = uVar4 * 0x100000001b3 ^ uVar12;
        }
      }
      else {
        if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
          uVar5 = (ulong)info->libraryCount;
          uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
          ppVVar2 = info->pLibraries;
          h->h = uVar4;
          if (uVar5 != 0) {
            lVar13 = 0;
            do {
              uVar4 = ((uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar2 + lVar13)) *
                       0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar2 + lVar13 + 4)) * 0x100000001b3
                      ^ (ulong)*(uint *)((long)ppVVar2 + lVar13 + 8);
              lVar13 = lVar13 + 0xc;
            } while (uVar5 * 0xc != lVar13);
            goto LAB_00157806;
          }
          goto LAB_0015780a;
        }
        if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
          if (VVar1 != VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) goto LAB_00157830;
          goto LAB_00157037;
        }
        uVar5 = (ulong)info->libraryCount;
        if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
           (dynamic_state_info->tessellation_domain_origin == false)) goto LAB_001577ff;
LAB_0015779c:
        uVar5 = 0;
      }
LAB_001577ff:
      uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
LAB_00157806:
      h->h = uVar4;
    }
    else {
      if (0x3b9f948f < (int)VVar1) {
        if (0x3ba09a48 < (int)VVar1) {
          if ((int)VVar1 < 0x3ba1c711) {
            if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
              if (VVar1 != VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT)
              goto LAB_00157830;
              uVar4 = uVar4 * 0x100000001b3 ^ (ulong)info[1].sType;
LAB_0015749e:
              uVar4 = ((uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount) * 0x100000001b3 ^
                      (ulong)*(uint *)&info->field_0x14) * 0x100000001b3 ^
                      (ulong)*(uint *)&info->pLibraries;
              uVar5 = (ulong)*(uint *)((long)&info->pLibraries + 4);
              goto LAB_001577ff;
            }
            uVar10 = info->libraryCount;
            uVar4 = uVar4 * 0x100000001b3 ^ (ulong)uVar10;
            ppVVar2 = info->pLibraries;
            h->h = uVar4;
            if (((dynamic_state_info != (DynamicStateInfo *)0x0) &&
                (dynamic_state_info->color_write_enable == false)) && (uVar10 != 0)) {
              uVar5 = 0;
              do {
                uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar2 + uVar5 * 4);
                uVar5 = uVar5 + 1;
              } while (uVar10 != uVar5);
              goto LAB_00157806;
            }
          }
          else {
            if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) goto LAB_00157037;
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
              uVar4 = ((ulong)((uint)*(ulong *)&info->libraryCount & 0x7ffffc3f) ^
                      uVar4 * 0x100000001b3) * 0x100000001b3 ^ *(ulong *)&info->libraryCount >> 0x20
              ;
              goto LAB_00157806;
            }
            if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT)
            goto LAB_00157830;
            ppVVar2 = info->pLibraries;
            if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
               (dynamic_state_info->depth_clamp_range == false)) {
              uVar4 = uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount;
              if (ppVVar2 != (VkPipeline *)0x0 && (ulong)info->libraryCount == 1) {
                uVar12 = (ulong)*(uint *)ppVVar2;
                uVar5 = (ulong)*(uint *)((long)ppVVar2 + 4);
                goto LAB_0015747e;
              }
              goto LAB_0015731d;
            }
          }
          goto LAB_0015780a;
        }
        if ((int)VVar1 < 0x3ba0251a) {
          if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
            uVar4 = (ulong)info[1].pNext & 0xffffffff ^
                    ((*(ulong *)(info + 1) & 0xffffffff ^
                     (((ulong)info->pLibraries & 0xffffffff ^
                      ((*(ulong *)&info->libraryCount & 0xffffffff ^ uVar4 * 0x100000001b3) *
                       0x100000001b3 ^ *(ulong *)&info->libraryCount >> 0x20) * 0x100000001b3) *
                      0x100000001b3 ^ (ulong)info->pLibraries >> 0x20) * 0x100000001b3) *
                     0x100000001b3 ^ *(ulong *)(info + 1) >> 0x20) * 0x100000001b3;
            uVar5 = (ulong)info[1].pNext >> 0x20;
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT)
            goto LAB_00157830;
LAB_00157037:
            uVar5 = (ulong)info->libraryCount;
          }
          goto LAB_001577ff;
        }
        if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
          uVar5 = (ulong)info->libraryCount;
          uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
          ppVVar2 = info->pLibraries;
          h->h = uVar4;
          if (uVar5 == 0) goto LAB_0015780a;
          uVar12 = 0;
          do {
            uVar14 = (ulong)*(uint *)(ppVVar2 + uVar12 * 2);
            uVar4 = uVar4 * 0x100000001b3 ^ uVar14;
            if (uVar14 != 0) {
              uVar15 = 0;
              do {
                uVar4 = uVar4 * 0x100000001b3 ^
                        (ulong)*(uint *)(ppVVar2[uVar12 * 2 + 1] + uVar15 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar5);
        }
        else {
          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
            uVar5 = (ulong)info->libraryCount;
            if (dynamic_state_info != (DynamicStateInfo *)0x0) {
              cVar9 = dynamic_state_info->depth_clip_negative_one_to_one;
              goto joined_r0x001575c2;
            }
            goto LAB_001577ff;
          }
          if (VVar1 != VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT)
          goto LAB_00157830;
LAB_00156f03:
          uVar5 = (ulong)info->libraryCount;
          uVar12 = (ulong)*(uint *)&info->field_0x14;
LAB_0015742f:
          uVar4 = (uVar4 * 0x100000001b3 ^ uVar5) * 0x100000001b3 ^ uVar12;
        }
        goto LAB_00157806;
      }
      if ((int)VVar1 < 0x3b9eaa31) {
        if (0x3b9e5441 < (int)VVar1) {
          if (VVar1 != VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
            if (VVar1 != VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
              if (VVar1 != VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT)
              goto LAB_00157830;
              goto LAB_00156f03;
            }
            goto LAB_00157037;
          }
          uVar5 = (ulong)info->libraryCount;
          uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
          if (info->pLibraries == (VkPipeline *)0x0) {
            uVar4 = uVar4 * 0x100000001b3;
          }
          else if (uVar5 != 0) {
            uVar12 = 0;
            do {
              uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)info->pLibraries + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
          }
          if (*(uint **)(info + 1) == (uint *)0x0) {
            uVar4 = uVar4 * 0x100000001b3 ^ 0xffff;
          }
          else {
            uVar4 = uVar4 * 0x100000001b3 ^ (ulong)**(uint **)(info + 1);
          }
          if ((uint *)info[1].pNext == (uint *)0x0) {
            uVar4 = uVar4 * 0x100000001b3 ^ 0xffff;
            goto LAB_00157806;
          }
          uVar5 = (ulong)*info[1].pNext;
          goto LAB_001577ff;
        }
        if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
          if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
             (dynamic_state_info->fragment_shading_rate == false)) goto LAB_0015749e;
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) goto LAB_00157830;
          uVar5 = (ulong)info->libraryCount;
          ppVVar2 = info->pLibraries;
          uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
          h->h = uVar4;
          if (ppVVar2 == (VkPipeline *)0x0) goto LAB_0015731d;
          if (uVar5 != 0) {
            uVar12 = 0;
            do {
              uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar2 + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
            goto LAB_00157806;
          }
        }
      }
      else {
        if ((int)VVar1 < 0x3b9f1b7a) {
          if (VVar1 == 
              VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT) {
            uVar5 = (ulong)info->libraryCount;
            if (dynamic_state_info != (DynamicStateInfo *)0x0) {
              cVar9 = dynamic_state_info->provoking_vertex_mode;
joined_r0x001575c2:
              if (cVar9 != '\0') goto LAB_0015779c;
            }
            goto LAB_001577ff;
          }
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO)
          goto LAB_00157830;
          if (dynamic_state_info == (DynamicStateInfo *)0x0) {
            uVar10 = *(uint *)&info->field_0x14;
            bVar8 = uVar10 != 0;
            uVar4 = uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount;
LAB_001577cd:
            uVar5 = (ulong)uVar10;
          }
          else {
            uVar10 = *(uint *)&info->field_0x14;
            if (dynamic_state_info->line_rasterization_mode == true) {
              uVar4 = uVar4 * 0x100000001b3;
            }
            else {
              uVar4 = uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount;
            }
            bVar8 = (dynamic_state_info->line_stipple ^ 1U) &
                    (uVar10 != 0 | dynamic_state_info->line_stipple_enable);
            if (dynamic_state_info->line_stipple_enable == false) goto LAB_001577cd;
            uVar5 = 0;
          }
          uVar5 = uVar4 * 0x100000001b3 ^ uVar5;
          h->h = uVar5;
          uVar4 = (ulong)*(uint *)&info->pLibraries;
          if (bVar8 == 0) {
            uVar4 = 0;
          }
          uVar4 = uVar4 ^ uVar5 * 0x100000001b3;
          h->h = uVar4;
          uVar5 = (ulong)*(ushort *)((long)&info->pLibraries + 4);
          if (bVar8 == 0) {
            uVar5 = 0;
          }
          goto LAB_001577ff;
        }
        if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
          uVar5 = (ulong)info->libraryCount;
          uVar12 = (ulong)*(uint *)&info->field_0x14;
          if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
             (dynamic_state_info->depth_bias == false)) goto LAB_0015747e;
          goto LAB_0015731d;
        }
        if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
          uVar4 = uVar4 * 0x100000001b3 ^ (ulong)info->libraryCount;
          h->h = uVar4;
          uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
          h->h = uVar4;
          uVar4 = uVar4 * 0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
          h->h = uVar4;
          uVar5 = (ulong)*(uint *)((long)&info->pLibraries + 4);
          uVar12 = (ulong)info[1].sType;
          goto LAB_0015742f;
        }
        if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) goto LAB_00157830;
        bVar3 = hash_pnext_struct(recorder,h,info);
joined_r0x00156e03:
        if (!bVar3) {
          return false;
        }
      }
    }
LAB_0015780a:
    info = (VkPipelineLibraryCreateInfoKHR *)pnext_chain_skip_ignored_entries(info->pNext);
  } while( true );
}

Assistant:

static bool hash_pnext_chain(const StateRecorder *recorder, Hasher &h, const void *pNext,
                             const DynamicStateInfo *dynamic_state_info,
                             VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		if (pnext_chain_stype_is_hash_invariant(pin->sType))
		{
			pNext = pin->pNext;
			continue;
		}

		h.s32(pin->sType);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkAttachmentDescriptionStencilLayoutKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkAttachmentReferenceStencilLayoutKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext), state_flags);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext), dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerReductionModeCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkMemoryBarrier2KHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassCreationControlEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSampleLocationsInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext));
			break;

		default:
			log_error_pnext_chain("Unsupported pNext found, cannot hash.", pNext);
			return false;
		}

		pNext = pin->pNext;
	}

	return true;
}